

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall kratos::Generator::unwire(Generator *this,Var *var1,Var *var2)

{
  pointer psVar1;
  Var *pVVar2;
  _func_int **pp_Var3;
  bool bVar4;
  bool bVar5;
  pointer psVar6;
  shared_ptr<kratos::AssignStmt> sVar7;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::Stmt> target;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  
  auStack_58 = (undefined1  [8])0x0;
  target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar6 == psVar1) break;
    if (((psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
        Assign) {
      Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
      pVVar2 = (Var *)(((element_type *)((long)local_40 + 0xc0))->super_IRNode)._vptr_IRNode;
      if ((pVVar2 == var1) &&
         ((Var *)(((element_type *)((long)local_40 + 0xc0))->super_IRNode).fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == var2)) {
LAB_00175b96:
        auStack_58 = local_40;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign_stmt);
        bVar5 = true;
        bVar4 = false;
      }
      else {
        bVar5 = false;
        bVar4 = true;
        if ((pVVar2 == var2) &&
           ((Var *)(((element_type *)((long)local_40 + 0xc0))->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == var1)) goto LAB_00175b96;
      }
      if (assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (bVar4) goto LAB_00175bc2;
    }
    else {
LAB_00175bc2:
      bVar5 = false;
    }
    psVar6 = psVar6 + 1;
  } while (!bVar5);
  if (auStack_58 != (undefined1  [8])0x0) {
    sVar7 = Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
    pp_Var3 = (((element_type *)((long)local_40 + 0xc0))->super_IRNode)._vptr_IRNode;
    (**(code **)(*pp_Var3 + 0x98))
              (pp_Var3,local_40,
               sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    (**(code **)((((((element_type *)((long)local_40 + 0xc0))->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + 0x78))();
    remove_stmt(this,(shared_ptr<kratos::Stmt> *)auStack_58);
    if (assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  if (target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void Generator::unwire(Var &var1, Var &var2) {
    // brute force search matching statement
    std::shared_ptr<Stmt> target = nullptr;
    for (auto const &stmt : stmts_) {
        if (stmt->type() == StatementType::Assign) {
            auto assign_stmt = stmt->as<AssignStmt>();
            if ((assign_stmt->left() == &var1 && assign_stmt->right() == &var2) ||
                (assign_stmt->right() == &var1 && assign_stmt->left() == &var2)) {
                target = assign_stmt;
                break;
            }
        }
    }
    if (target) {
        auto assign_stmt = target->as<AssignStmt>();
        assign_stmt->left()->remove_source(assign_stmt);
        assign_stmt->right()->remove_sink(assign_stmt);
        remove_stmt(target);
    }
}